

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hsva_f(float *out_h,float *out_s,float *out_v,float *out_a,nk_color in)

{
  undefined1 local_40 [8];
  nk_colorf col;
  float *out_a_local;
  float *out_v_local;
  float *out_s_local;
  float *out_h_local;
  nk_color in_local;
  
  col._8_8_ = out_a;
  nk_color_f((float *)local_40,(float *)(local_40 + 4),&col.r,&col.g,in);
  nk_colorf_hsva_f(out_h,out_s,out_v,(float *)col._8_8_,_local_40);
  return;
}

Assistant:

NK_API void
nk_color_hsva_f(float *out_h, float *out_s,
    float *out_v, float *out_a, struct nk_color in)
{
    struct nk_colorf col;
    nk_color_f(&col.r,&col.g,&col.b,&col.a, in);
    nk_colorf_hsva_f(out_h, out_s, out_v, out_a, col);
}